

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,SparsityPrinter>::
ReadLinearExpr<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,SparsityPrinter>::AlgebraicConHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,SparsityPrinter> *this)

{
  uint uVar1;
  int iVar2;
  ArgList args;
  ulong local_28 [2];
  
  uVar1 = NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter>::ReadUInt
                    ((NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter> *)this,
                     *(uint *)(*(long *)(this + 8) + 4));
  iVar2 = NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter>::ReadUInt
                    ((NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter> *)this,1,
                     **(int **)(this + 8) + 1);
  TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  local_28[0] = (ulong)uVar1;
  args.field_1.values_ = (Value *)local_28;
  args.types_ = 2;
  fmt::print((CStringRef)0x13a100,args);
  NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter>::
  ReadLinearExpr<SparsityPrinter::LinearObjHandler>
            ((NLReader<mp::internal::TextReader<fmt::Locale>,_SparsityPrinter> *)this,iVar2);
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr() {
  LinearHandler lh(*this);
  int index = ReadUInt(lh.num_items());
  // The number of terms should be less than num_vars because common
  // expressions are not allowed in a linear expression.
  int num_terms = ReadUInt(1, header_.num_vars + 1u);
  reader_.ReadTillEndOfLine();
  if (lh.SkipExpr(index))
    ReadLinearExpr(num_terms, NullLinearExprHandler());
  else
    ReadLinearExpr(num_terms, lh.OnLinearExpr(index, num_terms));
}